

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardhandler.cpp
# Opt level: O2

unique_ptr<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>_> __thiscall
QEvdevKeyboardHandler::create
          (QEvdevKeyboardHandler *this,QString *device,QString *specification,
          QString *defaultKeymapFile)

{
  char16_t *pcVar1;
  qsizetype qVar2;
  Data *pDVar3;
  bool bVar4;
  bool disableZap;
  bool enableCompose;
  int iVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined4 extraout_var;
  QEvdevKeyboardHandler *this_00;
  long lVar8;
  mode_t mode;
  mode_t mode_00;
  char *pcVar9;
  QStringView *this_01;
  long in_FS_OFFSET;
  QLatin1StringView s;
  QLatin1StringView s_00;
  QLatin1StringView s_01;
  QLatin1StringView s_02;
  QStringView QVar10;
  int local_d8;
  int local_d4;
  undefined8 local_d0;
  QStringView local_a8;
  QArrayDataPointer<QStringView> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivateLogging::qLcEvdevKey();
  if (((byte)QtPrivateLogging::qLcEvdevKey::category.field_2.bools.enabledDebug._q_value._M_base.
             _M_i & 1) != 0) {
    local_58.d._0_4_ = 2;
    local_58.d._4_4_ = 0;
    local_58.ptr._0_4_ = 0;
    local_58.ptr._4_4_ = 0;
    local_58.size._0_4_ = 0;
    local_58.size._4_4_ = 0;
    local_40 = QtPrivateLogging::qLcEvdevKey::category.name;
    uVar6 = QString::utf16();
    uVar7 = QString::utf16();
    QMessageLogger::debug
              ((char *)&local_58,"Try to create keyboard handler for \"%ls\" \"%ls\"",uVar6,uVar7);
  }
  local_78.d = (defaultKeymapFile->d).d;
  local_78.ptr = (defaultKeymapFile->d).ptr;
  local_78.size = (defaultKeymapFile->d).size;
  if (local_78.d != (Data *)0x0) {
    LOCK();
    ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d._0_4_ = 0xaaaaaaaa;
  local_98.d._4_4_ = 0xaaaaaaaa;
  local_98.ptr._0_4_ = 0xaaaaaaaa;
  local_98.ptr._4_4_ = 0xaaaaaaaa;
  pcVar1 = (specification->d).ptr;
  qVar2 = (specification->d).size;
  local_58.d._0_4_ = (int)qVar2;
  local_58.d._4_4_ = (int)((ulong)qVar2 >> 0x20);
  local_58.ptr._0_4_ = SUB84(pcVar1,0);
  local_58.ptr._4_4_ = (undefined4)((ulong)pcVar1 >> 0x20);
  local_d0 = 0;
  QStringView::split(&local_98,&local_58,0x3a,0,1);
  this_01 = (QStringView *)CONCAT44(local_98.ptr._4_4_,local_98.ptr._0_4_);
  local_d4 = 400;
  local_d8 = 0x50;
  enableCompose = false;
  disableZap = false;
  for (lVar8 = local_98.size << 4; lVar8 != 0; lVar8 = lVar8 + -0x10) {
    s.m_data = "keymap=";
    s.m_size = 7;
    bVar4 = QStringView::startsWith(this_01,s,CaseSensitive);
    if (bVar4) {
      local_a8 = QStringView::mid(this_01,7,-1);
      QStringView::toString((QString *)&local_58,&local_a8);
      pDVar3 = (Data *)CONCAT44(local_58.d._4_4_,(int)local_58.d);
      pcVar1 = (char16_t *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
      local_58.d._0_4_ = (int)local_78.d;
      local_58.d._4_4_ = (int)((ulong)local_78.d >> 0x20);
      local_58.ptr._0_4_ = SUB84(local_78.ptr,0);
      local_58.ptr._4_4_ = (undefined4)((ulong)local_78.ptr >> 0x20);
      qVar2 = CONCAT44(local_58.size._4_4_,(undefined4)local_58.size);
      local_58.size._0_4_ = (undefined4)local_78.size;
      local_58.size._4_4_ = (undefined4)((ulong)local_78.size >> 0x20);
      local_78.d = pDVar3;
      local_78.ptr = pcVar1;
      local_78.size = qVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
    else {
      local_58.d._0_4_ = 0xb;
      local_58.d._4_4_ = 0;
      local_58.ptr._0_4_ = 0x1361ca;
      local_58.ptr._4_4_ = 0;
      bVar4 = comparesEqual((QLatin1StringView *)&local_58,this_01);
      if (bVar4) {
        disableZap = true;
      }
      else {
        local_58.d._0_4_ = 0xe;
        local_58.d._4_4_ = 0;
        local_58.ptr._0_4_ = 0x1361d6;
        local_58.ptr._4_4_ = 0;
        bVar4 = comparesEqual((QLatin1StringView *)&local_58,this_01);
        if (bVar4) {
          enableCompose = true;
        }
        else {
          s_00.m_data = "repeat-delay=";
          s_00.m_size = 0xd;
          bVar4 = QStringView::startsWith(this_01,s_00,CaseSensitive);
          if (bVar4) {
            QVar10 = QStringView::mid(this_01,0xd,-1);
            local_58.d._0_4_ = (int)QVar10.m_size;
            local_58.d._4_4_ = QVar10.m_size._4_4_;
            local_58.ptr._0_4_ = QVar10.m_data._0_4_;
            local_58.ptr._4_4_ = QVar10.m_data._4_4_;
            local_d4 = QStringView::toInt((QStringView *)&local_58,(bool *)0x0,10);
          }
          else {
            s_01.m_data = "repeat-rate=";
            s_01.m_size = 0xc;
            bVar4 = QStringView::startsWith(this_01,s_01,CaseSensitive);
            if (bVar4) {
              QVar10 = QStringView::mid(this_01,0xc,-1);
              local_58.d._0_4_ = (int)QVar10.m_size;
              local_58.d._4_4_ = QVar10.m_size._4_4_;
              local_58.ptr._0_4_ = QVar10.m_data._0_4_;
              local_58.ptr._4_4_ = QVar10.m_data._4_4_;
              local_d8 = QStringView::toInt((QStringView *)&local_58,(bool *)0x0,10);
            }
            else {
              s_02.m_data = "grab=";
              s_02.m_size = 5;
              bVar4 = QStringView::startsWith(this_01,s_02,CaseSensitive);
              if (bVar4) {
                QVar10 = QStringView::mid(this_01,5,-1);
                local_58.d._0_4_ = (int)QVar10.m_size;
                local_58.d._4_4_ = QVar10.m_size._4_4_;
                local_58.ptr._0_4_ = QVar10.m_data._0_4_;
                local_58.ptr._4_4_ = QVar10.m_data._4_4_;
                iVar5 = QStringView::toInt((QStringView *)&local_58,(bool *)0x0,10);
                local_d0 = CONCAT44(extraout_var,iVar5);
              }
            }
          }
        }
      }
    }
    this_01 = this_01 + 1;
  }
  QtPrivateLogging::qLcEvdevKey();
  if (((byte)QtPrivateLogging::qLcEvdevKey::category.field_2.bools.enabledDebug._q_value._M_base.
             _M_i & 1) != 0) {
    local_58.d._0_4_ = 2;
    local_58.d._4_4_ = 0;
    local_58.ptr._0_4_ = 0;
    local_58.ptr._4_4_ = 0;
    local_58.size._0_4_ = 0;
    local_58.size._4_4_ = 0;
    local_40 = QtPrivateLogging::qLcEvdevKey::category.name;
    uVar6 = QString::utf16();
    QMessageLogger::debug((char *)&local_58,"Opening keyboard at %ls",uVar6);
  }
  QString::toLocal8Bit((QByteArray *)&local_58,device);
  pcVar9 = (char *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
  if (pcVar9 == (char *)0x0) {
    pcVar9 = (char *)&QByteArray::_empty;
  }
  iVar5 = qt_safe_open(pcVar9,0x802,mode);
  local_a8.m_size._0_4_ = iVar5;
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
  if (iVar5 < 0) {
    QtPrivateLogging::qLcEvdevKey();
    if (((byte)QtPrivateLogging::qLcEvdevKey::category.field_2.bools.enabledDebug._q_value._M_base.
               _M_i & 1) != 0) {
      local_58.d._0_4_ = 2;
      local_58.d._4_4_ = 0;
      local_58.ptr._0_4_ = 0;
      local_58.ptr._4_4_ = 0;
      local_58.size._0_4_ = 0;
      local_58.size._4_4_ = 0;
      local_40 = QtPrivateLogging::qLcEvdevKey::category.name;
      QMessageLogger::debug
                ((char *)&local_58,
                 "Keyboard device could not be opened as read-write, trying read-only");
    }
    QString::toLocal8Bit((QByteArray *)&local_58,device);
    pcVar9 = (char *)CONCAT44(local_58.ptr._4_4_,local_58.ptr._0_4_);
    if (pcVar9 == (char *)0x0) {
      pcVar9 = (char *)&QByteArray::_empty;
    }
    iVar5 = qt_safe_open(pcVar9,0x800,mode_00);
    QFdContainer::reset((QFdContainer *)&local_a8);
    local_a8.m_size._0_4_ = iVar5;
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_58);
    iVar5 = (int)local_a8.m_size;
    if ((int)local_a8.m_size < 0) {
      uVar6 = QString::utf16();
      this_00 = (QEvdevKeyboardHandler *)0x0;
      qErrnoWarning("Cannot open keyboard input device \'%ls\'",uVar6);
      goto LAB_00125d13;
    }
  }
  ioctl(iVar5,0x40044590,local_d0);
  if (0 < local_d8 && 0 < local_d4) {
    local_58.d._0_4_ = local_d4;
    local_58.d._4_4_ = local_d8;
    ioctl((int)local_a8.m_size,0x40084503);
  }
  this_00 = (QEvdevKeyboardHandler *)operator_new(0x68);
  QEvdevKeyboardHandler
            (this_00,device,(QFdContainer *)&local_a8,disableZap,enableCompose,(QString *)&local_78)
  ;
LAB_00125d13:
  *(QEvdevKeyboardHandler **)this = this_00;
  QFdContainer::reset((QFdContainer *)&local_a8);
  QArrayDataPointer<QStringView>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>,_true,_true>
          )(__uniq_ptr_data<QEvdevKeyboardHandler,_std::default_delete<QEvdevKeyboardHandler>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<QEvdevKeyboardHandler> QEvdevKeyboardHandler::create(const QString &device,
                                                     const QString &specification,
                                                     const QString &defaultKeymapFile)
{
    qCDebug(qLcEvdevKey, "Try to create keyboard handler for \"%ls\" \"%ls\"",
            qUtf16Printable(device), qUtf16Printable(specification));

    QString keymapFile = defaultKeymapFile;
    int repeatDelay = 400;
    int repeatRate = 80;
    bool disableZap = false;
    bool enableCompose = false;
    int grab = 0;

    const auto args = QStringView{specification}.split(u':');
    for (const auto &arg : args) {
        if (arg.startsWith("keymap="_L1))
            keymapFile = arg.mid(7).toString();
        else if (arg == "disable-zap"_L1)
            disableZap = true;
        else if (arg == "enable-compose"_L1)
            enableCompose = true;
        else if (arg.startsWith("repeat-delay="_L1))
            repeatDelay = arg.mid(13).toInt();
        else if (arg.startsWith("repeat-rate="_L1))
            repeatRate = arg.mid(12).toInt();
        else if (arg.startsWith("grab="_L1))
            grab = arg.mid(5).toInt();
    }

    qCDebug(qLcEvdevKey, "Opening keyboard at %ls", qUtf16Printable(device));

    QFdContainer fd(qt_safe_open(device.toLocal8Bit().constData(), O_RDWR | O_NDELAY, 0));
    if (fd.get() < 0) {
        qCDebug(qLcEvdevKey, "Keyboard device could not be opened as read-write, trying read-only");
        fd.reset(qt_safe_open(device.toLocal8Bit().constData(), O_RDONLY | O_NDELAY, 0));
    }
    if (fd.get() >= 0) {
        ::ioctl(fd.get(), EVIOCGRAB, grab);
        if (repeatDelay > 0 && repeatRate > 0) {
            int kbdrep[2] = { repeatDelay, repeatRate };
            ::ioctl(fd.get(), EVIOCSREP, kbdrep);
        }

        return std::unique_ptr<QEvdevKeyboardHandler>(new QEvdevKeyboardHandler(device, fd, disableZap, enableCompose, keymapFile));
    } else {
        qErrnoWarning("Cannot open keyboard input device '%ls'", qUtf16Printable(device));
        return nullptr;
    }
}